

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlocalserver.cpp
# Opt level: O2

void QLocalServer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QFlagsStorageHelper<QLocalServer::SocketOption,_4> *pQVar1;
  long *plVar2;
  QFlagsStorageHelper<QLocalServer::SocketOption,_4> QVar3;
  
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 1) {
      QLocalServerPrivate::_q_onNewConnection(*(QLocalServerPrivate **)(_o + 8));
      return;
    }
    if (_id == 0) {
      newConnection((QLocalServer *)_o);
      return;
    }
    break;
  case ReadProperty:
    if (_id == 0) {
      pQVar1 = (QFlagsStorageHelper<QLocalServer::SocketOption,_4> *)*_a;
      QVar3.super_QFlagsStorage<QLocalServer::SocketOption>.i =
           (QFlagsStorage<QLocalServer::SocketOption>)socketOptions((QLocalServer *)_o);
      pQVar1->super_QFlagsStorage<QLocalServer::SocketOption> =
           QVar3.super_QFlagsStorage<QLocalServer::SocketOption>.i;
      return;
    }
    break;
  case WriteProperty:
    if (_id == 0) {
      setSocketOptions((QLocalServer *)_o,
                       (QFlagsStorageHelper<QLocalServer::SocketOption,_4>)
                       ((QFlagsStorageHelper<QLocalServer::SocketOption,_4> *)*_a)->
                       super_QFlagsStorage<QLocalServer::SocketOption>);
      return;
    }
    break;
  default:
    if (_c == BindableProperty && _id == 0) {
      plVar2 = (long *)*_a;
      *plVar2 = *(long *)(_o + 8) + 0xf8;
      plVar2[1] = (long)&QtPrivate::
                         QBindableInterfaceForProperty<QObjectBindableProperty<QLocalServerPrivate,_QFlags<QLocalServer::SocketOption>,_&QLocalServerPrivate::_qt_property_socketOptions_offset,_nullptr>,_void>
                         ::iface;
      return;
    }
    break;
  case IndexOfMethod:
    QtMocHelpers::indexOfMethod<void(QLocalServer::*)()>
              ((QtMocHelpers *)_a,(void **)newConnection,0,0);
    return;
  }
  return;
}

Assistant:

void QLocalServer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QLocalServer *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->newConnection(); break;
        case 1: _t->d_func()->_q_onNewConnection(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QLocalServer::*)()>(_a, &QLocalServer::newConnection, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: QtMocHelpers::assignFlags<SocketOptions>(_v, _t->socketOptions()); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSocketOptions(*reinterpret_cast<SocketOptions*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableSocketOptions(); break;
        default: break;
        }
    }
}